

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::FixedChargeAtypeParameters> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<OpenMD::FixedChargeAtypeParameters> *)0x343d38);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}